

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

TValue * index2adr(lua_State *L,int idx)

{
  ulong uVar1;
  ulong uVar2;
  TValue *local_b8;
  TValue *local_b0;
  TValue *local_78;
  TValue *o_2;
  GCfunc *fn;
  TValue *o_1;
  TValue *o;
  int idx_local;
  lua_State *L_local;
  
  if (idx < 1) {
    if (idx < -9999) {
      if (idx == -0x2712) {
        uVar1 = (ulong)(L->glref).ptr32;
        local_78 = (TValue *)(uVar1 + 0xa0);
        (local_78->field_2).field_0 =
             (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)(L->env).gcptr32;
        *(undefined4 *)(uVar1 + 0xa4) = 0xfffffff4;
      }
      else if (idx == -10000) {
        local_78 = (TValue *)((ulong)(L->glref).ptr32 + 0x98);
      }
      else {
        uVar1 = (ulong)L->base[-1].u32.lo;
        if (idx == -0x2711) {
          uVar2 = (ulong)(L->glref).ptr32;
          local_78 = (TValue *)(uVar2 + 0xa0);
          (local_78->field_2).field_0 =
               *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)(uVar1 + 8);
          *(undefined4 *)(uVar2 + 0xa4) = 0xfffffff4;
        }
        else {
          if ((int)(uint)*(byte *)(uVar1 + 7) < -idx + -0x2712) {
            local_b8 = (TValue *)((ulong)(L->glref).ptr32 + 0x68);
          }
          else {
            local_b8 = (TValue *)(uVar1 + 0x20 + (long)(-idx + -0x2713) * 8);
          }
          local_78 = local_b8;
        }
      }
    }
    else {
      local_78 = L->top + idx;
    }
  }
  else {
    local_b0 = L->base + (idx + -1);
    if (L->top <= local_b0) {
      local_b0 = (TValue *)((ulong)(L->glref).ptr32 + 0x68);
    }
    local_78 = local_b0;
  }
  return local_78;
}

Assistant:

static TValue *index2adr(lua_State *L, int idx)
{
  if (idx > 0) {
    TValue *o = L->base + (idx - 1);
    return o < L->top ? o : niltv(L);
  } else if (idx > LUA_REGISTRYINDEX) {
    api_check(L, idx != 0 && -idx <= L->top - L->base);
    return L->top + idx;
  } else if (idx == LUA_GLOBALSINDEX) {
    TValue *o = &G(L)->tmptv;
    settabV(L, o, tabref(L->env));
    return o;
  } else if (idx == LUA_REGISTRYINDEX) {
    return registry(L);
  } else {
    GCfunc *fn = curr_func(L);
    api_check(L, fn->c.gct == ~LJ_TFUNC && !isluafunc(fn));
    if (idx == LUA_ENVIRONINDEX) {
      TValue *o = &G(L)->tmptv;
      settabV(L, o, tabref(fn->c.env));
      return o;
    } else {
      idx = LUA_GLOBALSINDEX - idx;
      return idx <= fn->c.nupvalues ? &fn->c.upvalue[idx-1] : niltv(L);
    }
  }
}